

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_suite.cpp
# Opt level: O0

void ctor_suite::construct_array_from_nested_initializer(void)

{
  basic_variable<std::allocator<char>> *this;
  basic_variable<std::allocator<char>_> *this_00;
  size_type in_RCX;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init;
  basic_variable<std::allocator<char>_> *local_158;
  basic_variable<std::allocator<char>_> *local_140;
  undefined4 local_134;
  size_type local_130;
  undefined1 local_127;
  undefined1 local_126 [2];
  undefined4 local_124;
  size_type local_120 [2];
  undefined1 local_110;
  undefined1 local_10f [2];
  undefined1 local_10d;
  basic_variable<std::allocator<char>_> *local_100;
  basic_variable<std::allocator<char>_> local_f8;
  basic_variable<std::allocator<char>_> local_c8;
  undefined1 auStack_98 [32];
  basic_variable<std::allocator<char>_> local_78;
  undefined1 local_48 [16];
  undefined1 local_38 [8];
  variable data;
  
  local_10d = 1;
  auStack_98._24_8_ = &local_78;
  local_100 = &local_f8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_100,"alpha");
  local_100 = &local_c8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_100,"helium");
  auStack_98._8_8_ = &local_f8;
  auStack_98._16_8_ = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            (&local_78,
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)
             (auStack_98 + 8));
  local_10d = 0;
  local_48._0_8_ = &local_78;
  local_48._8_8_ = 1;
  init._M_len = in_RCX;
  init._M_array = (iterator)0x1;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)local_38,
             (basic_array<std::allocator<char>_> *)local_48._0_8_,init);
  local_140 = (basic_variable<std::allocator<char>_> *)local_48;
  do {
    local_140 = local_140 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_140);
  } while (local_140 != &local_78);
  local_158 = (basic_variable<std::allocator<char>_> *)auStack_98;
  do {
    local_158 = local_158 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_158);
  } while (local_158 != &local_f8);
  local_10f[0] = trial::dynamic::basic_variable<std::allocator<char>>::
                 is<trial::dynamic::basic_array<std::allocator<char>>>
                           ((basic_variable<std::allocator<char>> *)local_38);
  local_110 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<array>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xdd,"void ctor_suite::construct_array_from_nested_initializer()",local_10f,&local_110
            );
  local_120[0] = trial::dynamic::basic_variable<std::allocator<char>_>::size
                           ((basic_variable<std::allocator<char>_> *)local_38);
  local_124 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("data.size()","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xde,"void ctor_suite::construct_array_from_nested_initializer()",local_120,&local_124
            );
  this = (basic_variable<std::allocator<char>> *)
         trial::dynamic::basic_variable<std::allocator<char>_>::operator[]
                   ((basic_variable<std::allocator<char>_> *)local_38,0);
  local_126[0] = trial::dynamic::basic_variable<std::allocator<char>>::
                 is<trial::dynamic::basic_array<std::allocator<char>>>(this);
  local_127 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data[0].is<array>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xdf,"void ctor_suite::construct_array_from_nested_initializer()",local_126,&local_127
            );
  this_00 = trial::dynamic::basic_variable<std::allocator<char>_>::operator[]
                      ((basic_variable<std::allocator<char>_> *)local_38,0);
  local_130 = trial::dynamic::basic_variable<std::allocator<char>_>::size(this_00);
  local_134 = 2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("data[0].size()","2",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xe0,"void ctor_suite::construct_array_from_nested_initializer()",&local_130,
             &local_134);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_38);
  return;
}

Assistant:

void construct_array_from_nested_initializer()
{
    variable data = array::make({{ "alpha", "helium" }});
    TRIAL_PROTOCOL_TEST_EQUAL(data.is<array>(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(data.size(), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(data[0].is<array>(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(data[0].size(), 2);
}